

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsHovered(ImRect *bb,ImGuiID id,bool flatten_childs)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (((((GImGui->HoveredId != id && GImGui->HoveredId != 0) &&
        (GImGui->HoveredIdAllowOverlap != true)) ||
       ((GImGui->HoveredWindow != GImGui->CurrentWindow &&
        ((!flatten_childs || (GImGui->HoveredRootWindow != GImGui->CurrentWindow->RootWindow))))))
      || ((GImGui->ActiveId != id && GImGui->ActiveId != 0 && (GImGui->ActiveIdAllowOverlap != true)
          ))) || (bVar3 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), !bVar3)) {
    return false;
  }
  pIVar1 = pIVar2->FocusedWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    return true;
  }
  pIVar1 = pIVar1->RootWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    return true;
  }
  if ((pIVar1->Flags & 0x2000000) == 0) {
    return true;
  }
  if (pIVar1->WasActive != true) {
    return true;
  }
  return pIVar1 == pIVar2->HoveredRootWindow->RootWindow;
}

Assistant:

bool ImGui::IsHovered(const ImRect& bb, ImGuiID id, bool flatten_childs)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId == 0 || g.HoveredId == id || g.HoveredIdAllowOverlap)
    {
        ImGuiWindow* window = GetCurrentWindowRead();
        if (g.HoveredWindow == window || (flatten_childs && g.HoveredRootWindow == window->RootWindow))
            if ((g.ActiveId == 0 || g.ActiveId == id || g.ActiveIdAllowOverlap) && IsMouseHoveringRect(bb.Min, bb.Max))
                if (IsWindowContentHoverable(g.HoveredRootWindow))
                    return true;
    }
    return false;
}